

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O2

void aalcalcmeanonly::LoadOccurrence<occurrence>(occurrence *occ,FILE *fin)

{
  size_t sVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  undefined4 uVar4;
  double dVar5;
  double dVar7;
  undefined1 auVar6 [16];
  
  fread(&nPeriods_,4,1,(FILE *)fin);
  auVar6._8_4_ = SUB84(periodToWeighting_._24_8_,4);
  auVar6._0_8_ = periodToWeighting_._24_8_;
  auVar6._12_4_ = 0x45300000;
  uVar4 = (undefined4)periodToWeighting_._24_8_;
  if (periodToWeighting_._24_8_ == 0) {
    dVar7 = 1.0;
  }
  else {
    dVar7 = 0.0;
  }
  sVar1 = fread(occ,0xc,1,(FILE *)fin);
  while (sVar1 != 0) {
    iVar2 = std::
            _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)periodToWeighting_,&occ->period_no);
    dVar5 = dVar7;
    if (iVar2.super__Node_iterator_base<std::pair<const_int,_double>,_false>._M_cur !=
        (__node_type *)0x0) {
      pmVar3 = std::__detail::
               _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)periodToWeighting_,&occ->period_no);
      dVar5 = *pmVar3 * ((auVar6._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,uVar4) - 4503599627370496.0));
    }
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)eventToWeighting_,&occ->event_id);
    *pmVar3 = dVar5 + *pmVar3;
    if (maxPeriodNo_ < occ->period_no) {
      maxPeriodNo_ = occ->period_no;
    }
    sVar1 = fread(occ,0xc,1,(FILE *)fin);
  }
  if (maxPeriodNo_ <= nPeriods_) {
    fclose((FILE *)fin);
    return;
  }
  fprintf(_stderr,"FATAL: Maximum period number exceeds total number of periods in header of %s\n",
          "input/occurrence.bin");
  exit(1);
}

Assistant:

void LoadOccurrence(T &occ, FILE *fin) {

    size_t i = fread(&nPeriods_, sizeof(nPeriods_), 1, fin);
    double factor = (double)periodToWeighting_.size();
    double defaultWeighting = 1.0;
    if (periodToWeighting_.size() > 0) defaultWeighting = 0.0;

    i = fread(&occ, sizeof(occ), 1, fin);
    while (i != 0) {
      double weighting = defaultWeighting;
      if (periodToWeighting_.find(occ.period_no) != periodToWeighting_.end()) {
	weighting = periodToWeighting_[occ.period_no] * factor;
      }
      eventToWeighting_[occ.event_id] += weighting;
      if (maxPeriodNo_ < occ.period_no) maxPeriodNo_ = occ.period_no;
      i = fread(&occ, sizeof(occ), 1, fin);
    }

    if (maxPeriodNo_ > nPeriods_) {
      fprintf(stderr,
	      "FATAL: Maximum period number exceeds total number of periods in header of %s\n",
	      OCCURRENCE_FILE);
      exit(EXIT_FAILURE);
    }

    fclose(fin);

  }